

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O0

void __thiscall
sliding_puzzle::SlidingPuzzle::SlidingPuzzle(SlidingPuzzle *this,int size,int anchor)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  int iVar4;
  time_t tVar5;
  reference pvVar6;
  element_type *peVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  ostream *poVar11;
  double dVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  const_iterator local_b0;
  int local_a8;
  int local_a4;
  int index;
  int j_2;
  int i_3;
  int i_2;
  vector<int,_std::allocator<int>_> start_tiles;
  int local_78;
  int j_1;
  int i_1;
  int value;
  shared_ptr<sliding_puzzle::SlidingPuzzleState> local_60 [2];
  int local_3c;
  undefined1 local_38 [4];
  int j;
  array<double,_3UL> weight;
  int i;
  int anchor_local;
  int size_local;
  SlidingPuzzle *this_local;
  
  std::
  unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
  ::unordered_map(&this->explored_);
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::shared_ptr(&this->start_);
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::shared_ptr(&this->goal_);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (&this->heuristic_weight_);
  if ((SlidingPuzzle::seed_once & 1U) != 0) {
    SlidingPuzzle::seed_once = false;
    tVar5 = time((time_t *)0x0);
    srand((uint)tVar5);
  }
  hash_time = 0;
  puzzle_size = size;
  puzzle_anchor = anchor;
  this->num_inadmissible_heuristic_ = 4;
  this->heuristic_weight_range_[0] = 1.0;
  this->heuristic_weight_range_[1] = 5.0;
  for (weight._M_elems[2]._4_4_ = 0; weight._M_elems[2]._4_4_ < this->num_inadmissible_heuristic_;
      weight._M_elems[2]._4_4_ = weight._M_elems[2]._4_4_ + 1) {
    for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
      dVar12 = this->heuristic_weight_range_[0];
      iVar4 = rand();
      dVar1 = this->heuristic_weight_range_[1];
      dVar2 = this->heuristic_weight_range_[0];
      pvVar6 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_38,(long)local_3c);
      *pvVar6 = dVar12 + (double)iVar4 / (2147483647.0 / (dVar1 - dVar2));
    }
    std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::push_back
              (&this->heuristic_weight_,(value_type *)local_38);
  }
  std::make_shared<sliding_puzzle::SlidingPuzzleState>();
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::operator=(&this->start_,local_60);
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::~shared_ptr(local_60);
  std::make_shared<sliding_puzzle::SlidingPuzzleState>();
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::operator=
            (&this->goal_,(shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&i_1);
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::~shared_ptr
            ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&i_1);
  j_1 = 1;
  for (local_78 = 0; local_78 < puzzle_size; local_78 = local_78 + 1) {
    for (start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < puzzle_size;
        start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      dVar12 = pow((double)puzzle_size,2.0);
      peVar7 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->goal_);
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar7->state_,(long)local_78);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar8,(long)start_tiles.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar9 = j_1 % (int)dVar12;
      j_1 = j_1 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_3);
  for (j_2 = 0; j_2 < puzzle_size * puzzle_size; j_2 = j_2 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i_3,&j_2);
  }
  for (index = 0; index < puzzle_size; index = index + 1) {
    for (local_a4 = 0; local_a4 < puzzle_size; local_a4 = local_a4 + 1) {
      iVar4 = rand();
      sVar10 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)&i_3);
      local_a8 = (int)((ulong)(long)iVar4 % sVar10);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_3,(long)local_a8);
      vVar3 = *pvVar9;
      peVar7 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->start_);
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar7->state_,(long)index);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)local_a4);
      *pvVar9 = vVar3;
      local_c0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&i_3);
      local_b8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator+(&local_c0,(long)local_a8);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_b0,
                 &local_b8);
      std::vector<int,_std::allocator<int>_>::erase
                ((vector<int,_std::allocator<int>_> *)&i_3,local_b0);
    }
  }
  generateSolvableStartState(this,0x2ee);
  poVar11 = std::operator<<((ostream *)&std::cout,"The random start state is: ");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  peVar7 = std::
           __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->start_);
  poVar11 = operator<<((ostream *)&std::cout,peVar7);
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_3);
  return;
}

Assistant:

SlidingPuzzle::SlidingPuzzle(int size, int anchor)
{
  static bool seed_once = true;
  if (seed_once)
  {
    seed_once = false;
    srand(time(NULL));
  }
  
  puzzle_size = size;
  puzzle_anchor = anchor;
  
  hash_time = 0;
  
  // Multi heuristic params
  num_inadmissible_heuristic_ = 4;
  heuristic_weight_range_[0] = 1.0;
  heuristic_weight_range_[1] = 5.0;
  for (int i=0; i<num_inadmissible_heuristic_; ++i)
  {
    std::array<double,3> weight;
    for (int j=0; j<3; ++j)
    {
      weight[j] = heuristic_weight_range_[0] +
        static_cast<double>(rand())/
          (RAND_MAX/(heuristic_weight_range_[1]-heuristic_weight_range_[0]));
    }
    heuristic_weight_.push_back(weight);
  }
  
  start_ = std::make_shared<SlidingPuzzleState>();
  goal_ = std::make_shared<SlidingPuzzleState>();
  int value = 1;
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      goal_->state_[i][j] = value % static_cast<int>(pow(puzzle_size,2));
      ++value;
    }
  }

  // Random start state
  std::vector<int> start_tiles;
  for (int i=0; i<puzzle_size*puzzle_size; ++i)
  {
    start_tiles.push_back(i);
  }
  
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      int index = rand() % start_tiles.size();
      start_->state_[i][j] = start_tiles[index];
      start_tiles.erase(start_tiles.begin()+index);
    }
  }

  generateSolvableStartState(750);

  std::cout << "The random start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}